

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  uint uVar1;
  Address AVar2;
  AST *pAVar3;
  bool bVar4;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view postfix_02;
  string_view postfix_03;
  string_view postfix_04;
  string_view postfix_05;
  string_view postfix_06;
  string_view postfix_07;
  string_view postfix_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  string_view first_indent;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string_view first_indent_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  Block *pBVar5;
  value_type *pvVar6;
  bool bVar7;
  Enum EVar8;
  uint32_t __val;
  reference n_00;
  value_type *pvVar9;
  string *psVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  ConstExpr *pCVar13;
  uint64_t __val_00;
  VarExpr<(wabt::ExprType)22> *ve;
  VarExpr<(wabt::ExprType)18> *ve_00;
  VarExpr<(wabt::ExprType)23> *ve_01;
  VarExpr<(wabt::ExprType)19> *ve_02;
  VarExpr<(wabt::ExprType)24> *ve_03;
  const_reference pvVar14;
  IfExpr *pIVar15;
  reference this_00;
  size_type sVar16;
  size_t sVar17;
  size_t sVar18;
  size_type amount;
  reference pvVar19;
  reference args_2;
  BlockExprBase<(wabt::ExprType)7> *pBVar20;
  BlockExprBase<(wabt::ExprType)25> *pBVar21;
  vector<wabt::Var,_std::allocator<wabt::Var>_> *this_01;
  VarExpr<(wabt::ExprType)12> *pVVar22;
  VarExpr<(wabt::ExprType)38> *pVVar23;
  OpcodeExpr<(wabt::ExprType)16> *pOVar24;
  OpcodeExpr<(wabt::ExprType)53> *pOVar25;
  char *pcVar26;
  uint *puVar27;
  char (*in_R8) [4];
  string_view *in_R9;
  string_view y;
  string_view y_00;
  string_view y_01;
  undefined4 in_stack_fffffffffffff048;
  undefined4 in_stack_fffffffffffff04c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f50;
  string *local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e00;
  string *local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_db8;
  string *local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d58;
  string *local_d38;
  string_view local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  string_view local_ce0;
  Enum local_ccc;
  string local_cc8;
  Enum local_ca4;
  string local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  Precedence local_c5c;
  undefined1 local_c58 [4];
  Precedence precedence;
  string name;
  size_type local_c30;
  string_view local_c28;
  string_view local_c18;
  string_view local_c08;
  string_view local_bf8;
  string_view local_be8;
  reference local_bd8;
  Var *v;
  const_iterator __end3;
  const_iterator __begin3;
  VarVector *__range3;
  undefined1 local_bb0 [8];
  string ts;
  BrTableExpr *bte;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  iterator local_b60;
  size_type local_b58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b50;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b32;
  allocator local_b31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  iterator local_b10;
  size_type local_b08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ae2;
  allocator local_ae1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  iterator local_ac0;
  size_type local_ab8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ab0;
  string_view local_a98;
  string_view local_a88;
  string_view local_a78;
  string_view local_a68;
  string_view local_a58;
  string_view local_a48;
  string local_a38;
  string_view local_a18;
  string_view local_a08;
  char *local_9f8;
  char *jmp;
  VarExpr<(wabt::ExprType)9> *bie;
  string_view local_9e0;
  string_view local_9d0;
  string local_9c0;
  iterator local_9a0;
  size_type local_998;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_990;
  VarExpr<(wabt::ExprType)8> *local_978;
  VarExpr<(wabt::ExprType)8> *be_1;
  value_type local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_948;
  string_view local_940;
  string_view local_930;
  string local_920;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_900;
  const_iterator local_8f8;
  string_view local_8f0;
  string *local_8e0;
  Block *block;
  value_type *val_1;
  value_type local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a8;
  allocator local_899;
  value_type local_898;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_878;
  const_iterator local_870;
  string_view local_868;
  string_view local_858;
  string_view local_848;
  string local_838;
  reference local_818;
  value_type *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  iterator local_7e8;
  size_type local_7e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d8;
  string local_7c0;
  undefined1 local_7a0 [8];
  string s_1;
  value_type local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_758;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_750;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_748;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_740;
  string_view local_738;
  allocator local_721;
  value_type local_720;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_700;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e8;
  string_view local_6e0;
  char *local_6d0;
  char *local_6c8;
  undefined1 local_6c0 [8];
  string_view if_start;
  size_t width;
  bool multiline;
  value_type *ifs;
  value_type *thenp;
  Value *elsep;
  IfExpr *ife;
  Enum local_670;
  Opcode local_66c;
  LoadStoreExpr<(wabt::ExprType)44> *local_668;
  LoadStoreExpr<(wabt::ExprType)44> *se;
  LoadStoreExpr<(wabt::ExprType)21> *local_658;
  LoadStoreExpr<(wabt::ExprType)21> *le;
  size_type local_648;
  Enum local_63c;
  string local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  string_view local_5f8;
  OpcodeExpr<(wabt::ExprType)56> *local_5e8;
  OpcodeExpr<(wabt::ExprType)56> *ue;
  string local_5d8;
  string local_5b8;
  string_view local_598;
  OpcodeExpr<(wabt::ExprType)14> *local_588;
  OpcodeExpr<(wabt::ExprType)14> *ce;
  string_view local_560;
  Precedence local_550;
  Enum local_54c;
  Precedence prec;
  string opcs;
  OpcodeExpr<(wabt::ExprType)6> *be;
  VarExpr<(wabt::ExprType)24> *te;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  iterator local_4f0;
  size_type local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c1;
  string local_4c0;
  iterator local_4a0;
  size_type local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  uint64_t local_478;
  double local_470;
  double d;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  iterator local_420;
  size_type local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  uint32_t local_3f4;
  float local_3f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e9;
  float f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  iterator local_3a8;
  size_type local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_379;
  string local_378;
  iterator local_358;
  size_type local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  Type local_32c;
  Const *local_328;
  Const *c_1;
  size_type local_318;
  Enum local_30c;
  string local_308;
  string local_2e8;
  string local_2c8;
  string_view local_2a8;
  string_view local_298;
  string_view local_288;
  string_view local_278;
  string local_268;
  string_view local_248;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_235;
  Enum local_234;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  iterator local_1d0;
  size_type local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  string_view local_1a8;
  string_view local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  reference local_168;
  value_type *s;
  size_t i_1;
  undefined1 local_13a;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_139;
  string local_138;
  iterator local_118;
  size_type local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined4 local_ec;
  string_view local_e8;
  string_view local_d8;
  string local_c8;
  uint local_a8;
  allocator local_a1;
  Index i;
  string decls;
  Node *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *__range2;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  Node *parent_local;
  Node *n_local;
  Decompiler *this_local;
  Value *stats;
  
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)parent;
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::vector
            ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2)
  ;
  __end2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&n->children);
  c = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&n->children);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                                     *)&c), bVar7) {
    n_00 = __gnu_cxx::
           __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
           ::operator*(&__end2);
    DecompileExpr((Value *)((long)&decls.field_2 + 8),this,n_00,n);
    std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::push_back
              ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,(value_type *)((long)&decls.field_2 + 8));
    Value::~Value((Value *)((long)&decls.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>::
    operator++(&__end2);
  }
  puVar27 = &switchD_002778bb::switchdataD_002ec90c;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                  ,0x18a,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"let ",&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    for (local_a8 = 0; local_a8 < (n->u).field_0.var_count; local_a8 = local_a8 + 1) {
      if (local_a8 != 0) {
        std::__cxx11::string::operator+=((string *)&i,", ");
      }
      TempVarName_abi_cxx11_(&local_c8,this,(n->u).field_0.var_start + local_a8);
      std::__cxx11::string::operator+=((string *)&i,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::operator+=((string *)&i," = ");
    string_view::string_view(&local_d8,(string *)&i);
    string_view::string_view(&local_e8,"");
    postfix.size_ = local_e8.size_;
    postfix.data_ = local_e8.data_;
    WrapNAry(__return_storage_ptr__,this,
             (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2,
             local_d8,postfix,Assign);
    local_ec = 1;
    std::__cxx11::string::~string((string *)&i);
    break;
  case FlushedVar:
    TempVarName_abi_cxx11_(&local_138,this,(n->u).field_0.var_start);
    local_118 = &local_138;
    local_110 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_139);
    __l_10._M_len = local_110;
    __l_10._M_array = local_118;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,__l_10,&local_139);
    Value::Value(__return_storage_ptr__,&local_108,Atomic);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_139);
    local_d38 = (string *)&local_118;
    do {
      local_d38 = local_d38 + -1;
      std::__cxx11::string::~string((string *)local_d38);
    } while (local_d38 != &local_138);
    local_ec = 1;
    break;
  case Statements:
    local_13a = 0;
    memset(&i_1,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1);
    Value::Value(__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i_1,None);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i_1);
    for (s = (value_type *)0x0; pvVar6 = s,
        pvVar9 = (value_type *)
                 std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&n->children),
        pvVar6 < pvVar9; s = (value_type *)&s->field_0x1) {
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_168 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::back(&pvVar12->v);
      pcVar26 = (char *)std::__cxx11::string::back();
      if ((*pcVar26 != '}') && (pcVar26 = (char *)std::__cxx11::string::back(), *pcVar26 != ':')) {
        std::__cxx11::string::operator+=((string *)local_168,';');
      }
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_170._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pvVar12->v);
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_178._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pvVar12->v);
      local_180 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               (&__return_storage_ptr__->v);
      local_188 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               (local_170,local_178,
                                (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_180);
    }
    local_ec = 1;
    local_13a = 1;
    break;
  case EndReturn:
    string_view::string_view(&local_198,"return ");
    string_view::string_view(&local_1a8,"");
    postfix_00.size_ = local_1a8.size_;
    postfix_00.data_ = local_1a8.data_;
    WrapNAry(__return_storage_ptr__,this,
             (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2,
             local_198,postfix_00,None);
    local_ec = 1;
    break;
  case Decl:
    pAVar3 = this->cur_ast;
    psVar10 = Var::name_abi_cxx11_((n->u).var);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar3->vars_defined,psVar10);
    pmVar11->defined = true;
    psVar10 = Var::name_abi_cxx11_((n->u).var);
    std::__cxx11::string::string((string *)&local_230,(string *)psVar10);
    local_234 = (Enum)Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl(&local_210,this,&local_230,(Type)local_234);
    std::operator+(&local_1f0,"var ",&local_210);
    local_1d0 = &local_1f0;
    local_1c8 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_235);
    __l_09._M_len = local_1c8;
    __l_09._M_array = local_1d0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,__l_09,&local_235);
    Value::Value(__return_storage_ptr__,&local_1c0,None);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_235);
    local_d58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    do {
      local_d58 = local_d58 + -1;
      std::__cxx11::string::~string((string *)local_d58);
    } while (local_d58 != &local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    local_ec = 1;
    break;
  case DeclInit:
    pAVar3 = this->cur_ast;
    psVar10 = Var::name_abi_cxx11_((n->u).var);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar3->vars_defined,psVar10);
    if ((pmVar11->defined & 1U) == 0) {
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      psVar10 = Var::name_abi_cxx11_((n->u).var);
      std::__cxx11::string::string((string *)&local_308,(string *)psVar10);
      local_30c = (Enum)Func::GetLocalType(this->cur_func,(n->u).var);
      LocalDecl(&local_2e8,this,&local_308,(Type)local_30c);
      cat<char[5],std::__cxx11::string,char[4]>
                (&local_2c8,(wabt *)"var ",(char (*) [5])&local_2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ecb8d,in_R8
                );
      string_view::string_view(&local_2a8,&local_2c8);
      string_view::string_view((string_view *)&c_1,"");
      postfix_02.size_ = local_318;
      postfix_02.data_ = (char *)c_1;
      WrapChild(__return_storage_ptr__,this,pvVar12,local_2a8,postfix_02,None);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      local_ec = 1;
    }
    else {
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      psVar10 = Var::name_abi_cxx11_((n->u).var);
      string_view::string_view(&local_288,psVar10);
      local_278 = VarName(this,local_288);
      cat<wabt::string_view,char[4]>
                (&local_268,(wabt *)&local_278,(string_view *)0x2ecb8d,(char (*) [4])puVar27);
      string_view::string_view(&local_248,&local_268);
      string_view::string_view(&local_298,"");
      postfix_01.size_ = local_298.size_;
      postfix_01.data_ = local_298.data_;
      WrapChild(__return_storage_ptr__,this,pvVar12,local_248,postfix_01,None);
      std::__cxx11::string::~string((string *)&local_268);
      local_ec = 1;
    }
    break;
  case Expr:
  default:
    puVar27 = &switchD_0027812e::switchdataD_002ec92c;
    switch(n->etype) {
    case Binary:
      opcs.field_2._8_8_ = cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(n->e);
      local_54c = (((OpcodeExpr<(wabt::ExprType)6> *)opcs.field_2._8_8_)->opcode).enum_;
      OpcodeToToken_abi_cxx11_((string *)&prec,this,(Opcode)local_54c);
      local_550 = OtherBin;
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &prec,"*");
      if (((bVar7) ||
          (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&prec,"/"), bVar7)) ||
         (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prec,"%"), bVar7)) {
        local_550 = Multiply;
      }
      else {
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prec,"+");
        if ((bVar7) ||
           (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&prec,"-"), bVar7)) {
          local_550 = Add;
        }
        else {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prec,"&");
          if (((bVar7) ||
              (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&prec,"|"), bVar7)) ||
             (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&prec,"^"), bVar7)) {
            local_550 = Bit;
          }
          else {
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&prec,"<<");
            if ((bVar7) ||
               (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&prec,">>"), bVar7)) {
              local_550 = Shift;
            }
          }
        }
      }
      cat<char[2],std::__cxx11::string,char[2]>
                ((string *)&ce,(wabt *)0x2eccd1,(char (*) [2])&prec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2eccd1,
                 (char (*) [2])in_R8);
      string_view::string_view(&local_560,(string *)&ce);
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,local_560,false,local_550);
      std::__cxx11::string::~string((string *)&ce);
      local_ec = 1;
      std::__cxx11::string::~string((string *)&prec);
      break;
    case Block:
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      local_818 = pvVar12;
      pBVar20 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(n->e);
      string_view::string_view(&local_858,&(pBVar20->block).label);
      local_848 = VarName(this,local_858);
      cat<char[7],wabt::string_view,char[2]>
                (&local_838,(wabt *)"label ",(char (*) [7])&local_848,(string_view *)":",
                 (char (*) [2])in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pvVar12->v,&local_838);
      std::__cxx11::string::~string((string *)&local_838);
      if (((((args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
            (*(int *)&((args.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 3)) &&
           (*(int *)((long)&((args.
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) != 7)) &&
          (*(int *)((long)&((args.
                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) != 0x19)) &&
         ((*(int *)((long)&((args.
                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) != 0x14 ||
          (pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                               ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                                &((args.
                                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0), pvVar14 == n
          )))) {
        pvVar12 = local_818;
        sVar17 = this->indent_amount;
        string_view::string_view(&local_868);
        IndentValue(this,pvVar12,sVar17,local_868);
        pvVar12 = local_818;
        local_878._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&local_818->v);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_870,&local_878);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_898,"{",&local_899);
        local_8a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(&pvVar12->v,local_870,&local_898);
        std::__cxx11::string::~string((string *)&local_898);
        std::allocator<char>::~allocator((allocator<char> *)&local_899);
        pvVar12 = local_818;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8c8,"}",(allocator *)((long)&val_1 + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pvVar12->v,&local_8c8);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&val_1 + 7));
      }
      local_818->precedence = Atomic;
      Value::Value(__return_storage_ptr__,local_818);
      local_ec = 1;
      break;
    case Br:
      local_978 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(n->e);
      pcVar26 = "goto ";
      if ((n->u).field_0.var_start == 2) {
        pcVar26 = "continue ";
      }
      psVar10 = Var::name_abi_cxx11_(&local_978->var);
      string_view::string_view(&local_9e0,psVar10);
      local_9d0 = VarName(this,local_9e0);
      y.size_ = (size_type)in_R8;
      y.data_ = (char *)local_9d0.size_;
      operator+[abi_cxx11_(&local_9c0,(wabt *)pcVar26,local_9d0.data_,y);
      local_9a0 = &local_9c0;
      local_998 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&bie + 7));
      __l_02._M_len = local_998;
      __l_02._M_array = local_9a0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_990,__l_02,(allocator_type *)((long)&bie + 7));
      Value::Value(__return_storage_ptr__,&local_990,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_990);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&bie + 7));
      local_f28 = (string *)&local_9a0;
      do {
        local_f28 = local_f28 + -1;
        std::__cxx11::string::~string((string *)local_f28);
      } while (local_f28 != &local_9c0);
      local_ec = 1;
      break;
    case BrIf:
      jmp = (char *)cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(n->e);
      local_9f8 = "goto";
      if ((n->u).field_0.var_start == 2) {
        local_9f8 = "continue";
      }
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      string_view::string_view(&local_a08,"if (");
      psVar10 = Var::name_abi_cxx11_((Var *)(jmp + 0x40));
      string_view::string_view(&local_a58,psVar10);
      local_a48 = VarName(this,local_a58);
      cat<char[3],char_const*,char[2],wabt::string_view>
                (&local_a38,(wabt *)") ",(char (*) [3])&local_9f8,(char **)0x2eccd1,
                 (char (*) [2])&local_a48,in_R9);
      string_view::string_view(&local_a18,&local_a38);
      postfix_04.size_ = local_a18.size_;
      postfix_04.data_ = local_a18.data_;
      WrapChild(__return_storage_ptr__,this,pvVar12,local_a08,postfix_04,None);
      std::__cxx11::string::~string((string *)&local_a38);
      local_ec = 1;
      break;
    default:
      std::__cxx11::string::string((string *)local_c58);
      local_c5c = Atomic;
      switch(n->etype) {
      case Call:
        pVVar22 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(n->e);
        psVar10 = Var::name_abi_cxx11_(&pVVar22->var);
        std::__cxx11::string::operator=((string *)local_c58,(string *)psVar10);
        break;
      case CallIndirect:
        std::__cxx11::string::operator=((string *)local_c58,"call_indirect");
        break;
      default:
        pcVar26 = GetExprTypeName(n->etype);
        std::__cxx11::string::operator=((string *)local_c58,pcVar26);
        break;
      case Convert:
        pOVar24 = cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(n->e);
        local_ca4 = (pOVar24->opcode).enum_;
        OpcodeToToken_abi_cxx11_(&local_ca0,this,(Opcode)local_ca4);
        std::__cxx11::string::operator=((string *)local_c58,(string *)&local_ca0);
        std::__cxx11::string::~string((string *)&local_ca0);
        break;
      case MemoryCopy:
        std::__cxx11::string::operator=((string *)local_c58,"memory_copy");
        break;
      case MemoryFill:
        std::__cxx11::string::operator=((string *)local_c58,"memory_fill");
        break;
      case MemoryGrow:
        std::__cxx11::string::operator=((string *)local_c58,"memory_grow");
        break;
      case MemorySize:
        std::__cxx11::string::operator=((string *)local_c58,"memory_size");
        break;
      case RefIsNull:
        std::__cxx11::string::operator=((string *)local_c58,"is_null");
        break;
      case ReturnCall:
        pVVar23 = cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(n->e);
        psVar10 = Var::name_abi_cxx11_(&pVVar23->var);
        std::operator+(&local_c80,"return_call ",psVar10);
        std::__cxx11::string::operator=((string *)local_c58,(string *)&local_c80);
        std::__cxx11::string::~string((string *)&local_c80);
        local_c5c = None;
        break;
      case ReturnCallIndirect:
        std::__cxx11::string::operator=((string *)local_c58,"return_call call_indirect");
        break;
      case Select:
        std::__cxx11::string::operator=((string *)local_c58,"select_if");
        break;
      case Ternary:
        pOVar25 = cast<wabt::OpcodeExpr<(wabt::ExprType)53>,wabt::Expr>(n->e);
        local_ccc = (pOVar25->opcode).enum_;
        OpcodeToToken_abi_cxx11_(&local_cc8,this,(Opcode)local_ccc);
        std::__cxx11::string::operator=((string *)local_c58,(string *)&local_cc8);
        std::__cxx11::string::~string((string *)&local_cc8);
      }
      std::operator+(&local_d00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c58,
                     "(");
      string_view::string_view(&local_ce0,&local_d00);
      string_view::string_view(&local_d10,")");
      postfix_08.size_ = local_d10.size_;
      postfix_08.data_ = local_d10.data_;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_ce0,postfix_08,local_c5c);
      std::__cxx11::string::~string((string *)&local_d00);
      local_ec = 1;
      std::__cxx11::string::~string((string *)local_c58);
      break;
    case BrTable:
      ts.field_2._8_8_ = cast<wabt::BrTableExpr,wabt::Expr>(n->e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_bb0,"br_table[",(allocator *)((long)&__range3 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      this_01 = (vector<wabt::Var,_std::allocator<wabt::Var>_> *)(ts.field_2._8_8_ + 0x40);
      __end3 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(this_01);
      v = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(this_01);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                         *)&v), bVar7) {
        local_bd8 = __gnu_cxx::
                    __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                    ::operator*(&__end3);
        psVar10 = Var::name_abi_cxx11_(local_bd8);
        string_view::string_view(&local_bf8,psVar10);
        local_be8 = VarName(this,local_bf8);
        y_00.size_ = (size_type)puVar27;
        y_00.data_ = (char *)local_be8.size_;
        operator+=((wabt *)local_bb0,(string *)local_be8.data_,y_00);
        std::__cxx11::string::operator+=((string *)local_bb0,", ");
        __gnu_cxx::
        __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
        operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)local_bb0,"..");
      psVar10 = Var::name_abi_cxx11_((Var *)(ts.field_2._8_8_ + 0x58));
      string_view::string_view(&local_c18,psVar10);
      local_c08 = VarName(this,local_c18);
      y_01.size_ = (size_type)puVar27;
      y_01.data_ = (char *)local_c08.size_;
      operator+=((wabt *)local_bb0,(string *)local_c08.data_,y_01);
      std::__cxx11::string::operator+=((string *)local_bb0,"](");
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      string_view::string_view(&local_c28,(string *)local_bb0);
      string_view::string_view((string_view *)((long)&name.field_2 + 8),")");
      postfix_07.size_ = local_c30;
      postfix_07.data_ = (char *)name.field_2._8_8_;
      WrapChild(__return_storage_ptr__,this,pvVar12,local_c28,postfix_07,Atomic);
      local_ec = 1;
      std::__cxx11::string::~string((string *)local_bb0);
      break;
    case Compare:
      local_588 = cast<wabt::OpcodeExpr<(wabt::ExprType)14>,wabt::Expr>(n->e);
      ue._4_4_ = (local_588->opcode).enum_;
      OpcodeToToken_abi_cxx11_(&local_5d8,this,ue._4_4_);
      cat<char[2],std::__cxx11::string,char[2]>
                (&local_5b8,(wabt *)0x2eccd1,(char (*) [2])&local_5d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2eccd1,
                 (char (*) [2])in_R8);
      string_view::string_view(&local_598,&local_5b8);
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,local_598,false,Equal);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      local_ec = 1;
      break;
    case Const:
      pCVar13 = cast<wabt::ConstExpr,wabt::Expr>(n->e);
      local_328 = &pCVar13->const_;
      local_32c = Const::type(local_328);
      EVar8 = Type::operator_cast_to_Enum(&local_32c);
      switch(EVar8) {
      case V128:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_510,"V128",(allocator *)((long)&te + 7));
        local_4f0 = &local_510;
        local_4e8 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&te + 6));
        __l_04._M_len = local_4e8;
        __l_04._M_array = local_4f0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_4e0,__l_04,(allocator_type *)((long)&te + 6));
        Value::Value(__return_storage_ptr__,&local_4e0,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4e0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&te + 6));
        local_e00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4f0;
        do {
          local_e00 = local_e00 + -1;
          std::__cxx11::string::~string((string *)local_e00);
        } while (local_e00 != &local_510);
        std::allocator<char>::~allocator((allocator<char> *)((long)&te + 7));
        local_ec = 1;
        break;
      case F64:
        local_478 = Const::f64_bits(local_328);
        local_470 = Bitcast<double,unsigned_long>(&local_478);
        to_string_abi_cxx11_(&local_4c0,this,local_470);
        local_4a0 = &local_4c0;
        local_498 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_4c1);
        __l_05._M_len = local_498;
        __l_05._M_array = local_4a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_490,__l_05,&local_4c1);
        Value::Value(__return_storage_ptr__,&local_490,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_490);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_4c1);
        local_de8 = (string *)&local_4a0;
        do {
          local_de8 = local_de8 + -1;
          std::__cxx11::string::~string((string *)local_de8);
        } while (local_de8 != &local_4c0);
        local_ec = 1;
        break;
      case F32:
        local_3f4 = Const::f32_bits(local_328);
        local_3f0 = Bitcast<float,unsigned_int>(&local_3f4);
        to_string_abi_cxx11_(&local_460,this,(double)local_3f0);
        std::operator+(&local_440,&local_460,"f");
        local_420 = &local_440;
        local_418 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&d + 7));
        __l_06._M_len = local_418;
        __l_06._M_array = local_420;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_410,__l_06,(allocator_type *)((long)&d + 7));
        Value::Value(__return_storage_ptr__,&local_410,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_410);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&d + 7));
        local_dd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_420;
        do {
          local_dd0 = local_dd0 + -1;
          std::__cxx11::string::~string((string *)local_dd0);
        } while (local_dd0 != &local_440);
        std::__cxx11::string::~string((string *)&local_460);
        local_ec = 1;
        break;
      case I64:
        __val_00 = Const::u64(local_328);
        std::__cxx11::to_string((string *)&f,__val_00);
        std::operator+(&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,"L");
        local_3a8 = &local_3c8;
        local_3a0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_3e9);
        __l_07._M_len = local_3a0;
        __l_07._M_array = local_3a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_398,__l_07,&local_3e9);
        Value::Value(__return_storage_ptr__,&local_398,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_398);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_3e9);
        local_db8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8;
        do {
          local_db8 = local_db8 + -1;
          std::__cxx11::string::~string((string *)local_db8);
        } while (local_db8 != &local_3c8);
        std::__cxx11::string::~string((string *)&f);
        local_ec = 1;
        break;
      case I32:
        __val = Const::u32(local_328);
        std::__cxx11::to_string(&local_378,__val);
        local_358 = &local_378;
        local_350 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_379);
        __l_08._M_len = local_350;
        __l_08._M_array = local_358;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_348,__l_08,&local_379);
        Value::Value(__return_storage_ptr__,&local_348,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_348);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_379);
        local_da0 = (string *)&local_358;
        do {
          local_da0 = local_da0 + -1;
          std::__cxx11::string::~string((string *)local_da0);
        } while (local_da0 != &local_378);
        local_ec = 1;
        break;
      default:
        abort();
      }
      break;
    case Drop:
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      Value::Value(__return_storage_ptr__,pvVar12);
      local_ec = 1;
      break;
    case GlobalGet:
      ve_00 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(n->e);
      Get<(wabt::ExprType)18>(__return_storage_ptr__,this,ve_00);
      local_ec = 1;
      break;
    case GlobalSet:
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      ve_02 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(n->e);
      Set<(wabt::ExprType)19>(__return_storage_ptr__,this,pvVar12,ve_02);
      local_ec = 1;
      break;
    case If:
      pIVar15 = cast<wabt::IfExpr,wabt::Expr>(n->e);
      thenp = (value_type *)0x0;
      bVar7 = intrusive_list<wabt::Expr>::empty(&pIVar15->false_);
      if (!bVar7) {
        thenp = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,2);
      }
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,1);
      this_00 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      sVar16 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this_00->v);
      bVar7 = true;
      if (sVar16 < 2) {
        sVar16 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&pvVar12->v);
        bVar7 = 1 < sVar16;
      }
      sVar17 = Value::width(this_00);
      sVar18 = Value::width(pvVar12);
      if_start.size_ = sVar17 + sVar18;
      if (thenp != (value_type *)0x0) {
        sVar17 = Value::width(thenp);
        if_start.size_ = sVar17 + if_start.size_;
        bVar4 = !bVar7;
        bVar7 = true;
        if (bVar4) {
          sVar16 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&thenp->v);
          bVar7 = 1 < sVar16;
        }
      }
      bVar4 = true;
      if (!bVar7) {
        bVar4 = this->target_exp_width < if_start.size_;
      }
      if (bVar4) {
        string_view::string_view((string_view *)local_6c0,"if (");
        amount = string_view::size((string_view *)local_6c0);
        local_6d0 = (char *)local_6c0;
        local_6c8 = if_start.data_;
        first_indent_00.size_ = (size_type)if_start.data_;
        first_indent_00.data_ = (char *)local_6c0;
        IndentValue(this,this_00,amount,first_indent_00);
        pvVar19 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::back(&this_00->v);
        std::__cxx11::string::operator+=((string *)pvVar19,") {");
        sVar17 = this->indent_amount;
        string_view::string_view(&local_6e0);
        IndentValue(this,pvVar12,sVar17,local_6e0);
        local_6e8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pvVar12->v);
        local_6f0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pvVar12->v);
        local_6f8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::
                       back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                 (&this_00->v);
        local_700 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::
                       move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                 (local_6e8,local_6f0,
                                  (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )local_6f8);
        if (thenp != (value_type *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_720,"} else {",&local_721);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_00->v,&local_720);
          std::__cxx11::string::~string((string *)&local_720);
          std::allocator<char>::~allocator((allocator<char> *)&local_721);
          sVar17 = this->indent_amount;
          string_view::string_view(&local_738);
          IndentValue(this,thenp,sVar17,local_738);
          local_740._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&thenp->v);
          local_748._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&thenp->v);
          local_750 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)std::
                         back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                   (&this_00->v);
          local_758 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)std::
                         move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                   (local_740,local_748,
                                    (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )local_750);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_778,"}",(allocator *)(s_1.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->v,&local_778);
        std::__cxx11::string::~string((string *)&local_778);
        std::allocator<char>::~allocator((allocator<char> *)(s_1.field_2._M_local_buf + 0xf));
        this_00->precedence = If;
        Value::Value(__return_storage_ptr__,this_00);
        local_ec = 1;
      }
      else {
        pvVar19 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this_00->v,0);
        args_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&pvVar12->v,0);
        cat<char[5],std::__cxx11::string,char[5],std::__cxx11::string,char[3]>
                  ((string *)local_7a0,(wabt *)"if (",(char (*) [5])pvVar19,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") { ",
                   (char (*) [5])args_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                   (char (*) [3])CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048));
        if (thenp != (value_type *)0x0) {
          pvVar19 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&thenp->v,0);
          cat<char[9],std::__cxx11::string,char[3]>
                    (&local_7c0,(wabt *)" else { ",(char (*) [9])pvVar19,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" }",
                     (char (*) [3])args_2);
          std::__cxx11::string::operator+=((string *)local_7a0,(string *)&local_7c0);
          std::__cxx11::string::~string((string *)&local_7c0);
        }
        std::__cxx11::string::string((string *)&local_808,(string *)local_7a0);
        local_7e8 = &local_808;
        local_7e0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&val + 7));
        __l_03._M_len = local_7e0;
        __l_03._M_array = local_7e8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_7d8,__l_03,(allocator_type *)((long)&val + 7));
        Value::Value(__return_storage_ptr__,&local_7d8,If);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_7d8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&val + 7));
        local_ec8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7e8;
        do {
          local_ec8 = local_ec8 + -1;
          std::__cxx11::string::~string((string *)local_ec8);
        } while (local_ec8 != &local_808);
        local_ec = 1;
        std::__cxx11::string::~string((string *)local_7a0);
      }
      break;
    case Load:
      local_658 = cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
      uVar1 = local_658->offset;
      se._4_4_ = (local_658->opcode).enum_;
      AVar2 = local_658->align;
      se._0_4_ = Opcode::GetResultType(&local_658->opcode);
      LoadStore(this,pvVar12,pvVar14,(ulong)uVar1,se._4_4_,AVar2,se._0_4_);
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      Value::Value(__return_storage_ptr__,pvVar12);
      local_ec = 1;
      break;
    case LocalGet:
      ve = cast<wabt::VarExpr<(wabt::ExprType)22>,wabt::Expr>(n->e);
      Get<(wabt::ExprType)22>(__return_storage_ptr__,this,ve);
      local_ec = 1;
      break;
    case LocalSet:
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      ve_01 = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(n->e);
      Set<(wabt::ExprType)23>(__return_storage_ptr__,this,pvVar12,ve_01);
      local_ec = 1;
      break;
    case LocalTee:
      ve_03 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(n->e);
      bVar7 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::empty
                        ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          *)&__range2);
      if (bVar7) {
        Get<(wabt::ExprType)24>(__return_storage_ptr__,this,ve_03);
      }
      else {
        pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                  operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              *)&__range2,0);
        Set<(wabt::ExprType)24>(__return_storage_ptr__,this,pvVar12,ve_03);
      }
      local_ec = 1;
      break;
    case Loop:
      block = (Block *)std::
                       vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                       operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                   *)&__range2,0);
      pBVar21 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(n->e);
      pBVar5 = block;
      local_8e0 = &(pBVar21->block).label;
      sVar17 = this->indent_amount;
      string_view::string_view(&local_8f0);
      first_indent.size_ = local_8f0.size_;
      first_indent.data_ = local_8f0.data_;
      IndentValue(this,(Value *)pBVar5,sVar17,first_indent);
      pBVar5 = block;
      local_900._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)block);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_8f8,&local_900);
      string_view::string_view(&local_940,local_8e0);
      local_930 = VarName(this,local_940);
      cat<char[6],wabt::string_view,char[3]>
                (&local_920,(wabt *)"loop ",(char (*) [6])&local_930,(string_view *)0x2ed5ce,
                 (char (*) [3])local_8f0.size_);
      local_948 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)pBVar5,local_8f8,&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      pBVar5 = block;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_968,"}",(allocator *)((long)&be_1 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pBVar5,&local_968);
      std::__cxx11::string::~string((string *)&local_968);
      std::allocator<char>::~allocator((allocator<char> *)((long)&be_1 + 7));
      *(undefined4 *)((long)&(block->label).field_2 + 8) = 10;
      Value::Value(__return_storage_ptr__,(Value *)block);
      local_ec = 1;
      break;
    case Nop:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ae0,"nop",&local_ae1);
      local_ac0 = &local_ae0;
      local_ab8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_ae2);
      __l_01._M_len = local_ab8;
      __l_01._M_array = local_ac0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_ab0,__l_01,&local_ae2);
      Value::Value(__return_storage_ptr__,&local_ab0,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_ab0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_ae2);
      local_f50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ac0;
      do {
        local_f50 = local_f50 + -1;
        std::__cxx11::string::~string((string *)local_f50);
      } while (local_f50 != &local_ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      local_ec = 1;
      break;
    case RefNull:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b80,"null",(allocator *)((long)&bte + 7));
      local_b60 = &local_b80;
      local_b58 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&bte + 6));
      __l._M_len = local_b58;
      __l._M_array = local_b60;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b50,__l,(allocator_type *)((long)&bte + 6));
      Value::Value(__return_storage_ptr__,&local_b50,Atomic);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b50);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&bte + 6));
      local_f80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b60;
      do {
        local_f80 = local_f80 + -1;
        std::__cxx11::string::~string((string *)local_f80);
      } while (local_f80 != &local_b80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bte + 7));
      local_ec = 1;
      break;
    case Rethrow:
      string_view::string_view(&local_a88,"rethrow ");
      string_view::string_view(&local_a98,"");
      postfix_06.size_ = local_a98.size_;
      postfix_06.data_ = local_a98.data_;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_a88,postfix_06,None);
      local_ec = 1;
      break;
    case Return:
      string_view::string_view(&local_a68,"return ");
      string_view::string_view(&local_a78,"");
      postfix_05.size_ = local_a78.size_;
      postfix_05.data_ = local_a78.data_;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_a68,postfix_05,None);
      local_ec = 1;
      break;
    case Store:
      local_668 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(n->e);
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
      uVar1 = local_668->offset;
      local_66c.enum_ = (local_668->opcode).enum_;
      AVar2 = local_668->align;
      local_670 = (Enum)Opcode::GetParamType2(&local_668->opcode);
      LoadStore(this,pvVar12,pvVar14,(ulong)uVar1,local_66c,AVar2,(Type)local_670);
      string_view::string_view((string_view *)&ife," = ");
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,_ife,true,Assign);
      local_ec = 1;
      break;
    case Unary:
      local_5e8 = cast<wabt::OpcodeExpr<(wabt::ExprType)56>,wabt::Expr>(n->e);
      pvVar12 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      local_63c = (local_5e8->opcode).enum_;
      OpcodeToToken_abi_cxx11_(&local_638,this,(Opcode)local_63c);
      std::operator+(&local_618,&local_638,"(");
      string_view::string_view(&local_5f8,&local_618);
      string_view::string_view((string_view *)&le,")");
      postfix_03.size_ = local_648;
      postfix_03.data_ = (char *)le;
      WrapChild(__return_storage_ptr__,this,pvVar12,local_5f8,postfix_03,Atomic);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_638);
      local_ec = 1;
      break;
    case Last:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b30,"unreachable",&local_b31);
      local_b10 = &local_b30;
      local_b08 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_b32);
      __l_00._M_len = local_b08;
      __l_00._M_array = local_b10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b00,__l_00,&local_b32);
      Value::Value(__return_storage_ptr__,&local_b00,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b00);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_b32);
      local_f68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b10;
      do {
        local_f68 = local_f68 + -1;
        std::__cxx11::string::~string((string *)local_f68);
      } while (local_f68 != &local_b30);
      std::allocator<char>::~allocator((allocator<char> *)&local_b31);
      local_ec = 1;
    }
  }
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2)
  ;
  return __return_storage_ptr__;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) decls += ", ";
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value { { TempVarName(n.u.var_start) }, Precedence::Atomic };
      }
      case NodeType::Statements: {
        Value stats { {}, Precedence::None };
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') s += ';';
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{
            {"var " + LocalDecl(std::string(n.u.var->name()),
                                cur_func->GetLocalType(*n.u.var))},
            Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(
              args[0],
              cat("var ",
                  LocalDecl(std::string(n.u.var->name()),
                            cur_func->GetLocalType(*n.u.var)),
                  " = "),
              "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, cat(" ", opcs, " "), false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
         return WrapBinary(args, cat(" ", OpcodeToToken(ce.opcode), " "), false,
                           Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        //BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, " = ", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value *elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(), std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") { ", thenp.v[0], " }");
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
              cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements
                   && parent->etype != ExprType::Block
                   && parent->etype != ExprType::Loop
                   && (parent->etype != ExprType::If ||
                       &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (", cat(") ", jmp, " ",
                                              VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto &v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }